

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O2

wchar_t archive_compressor_gzip_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict4 *data;
  unsigned_long uVar1;
  wchar_t wVar2;
  
  data = (private_data_conflict4 *)f->data;
  uVar1 = crc32(data->crc);
  data->crc = uVar1;
  data->total_in = data->total_in + length;
  (data->stream).next_in = (Bytef *)buff;
  (data->stream).avail_in = (uInt)length;
  wVar2 = drive_compressor(f,data,L'\0');
  return wVar2;
}

Assistant:

static int
archive_compressor_gzip_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->crc = crc32(data->crc, (const Bytef *)buff, (uInt)length);
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = (uInt)length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}